

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

void snap_useuv(GCproto *pt,uint8_t *udf)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t v;
  GCobj *o;
  GCRef *kr;
  ptrdiff_t n;
  ptrdiff_t j;
  ptrdiff_t i;
  uint8_t *udf_local;
  GCproto *pt_local;
  
  if ((pt->flags & 1) != 0) {
    uVar2 = pt->sizekgc;
    kr = (GCRef *)(ulong)(pt->k).ptr32;
    for (i = 0; kr = kr + -1, i < (long)(ulong)uVar2; i = i + 1) {
      uVar3 = (ulong)kr->gcptr32;
      if (*(char *)(uVar3 + 5) == '\a') {
        for (j = 0; j < (long)(ulong)*(byte *)(uVar3 + 0x24); j = j + 1) {
          uVar1 = *(ushort *)((ulong)*(uint *)(uVar3 + 0x14) + j * 2);
          if ((uVar1 & 0x8000) != 0) {
            udf[uVar1 & 0xff] = '\0';
          }
        }
      }
    }
  }
  return;
}

Assistant:

void snap_useuv(GCproto *pt, uint8_t *udf)
{
  /* This is a coarse check, because it's difficult to correlate the lifetime
  ** of slots and closures. But the number of false positives is quite low.
  ** A false positive may cause a slot not to be purged, which is just
  ** a missed optimization.
  */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, j, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO) {
	for (j = 0; j < gco2pt(o)->sizeuv; j++) {
	  uint32_t v = proto_uv(gco2pt(o))[j];
	  if ((v & PROTO_UV_LOCAL)) {
	    udf[(v & 0xff)] = 0;
	  }
	}
      }
    }
  }
}